

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QPolygonF * __thiscall
QGraphicsItem::mapToScene(QPolygonF *__return_storage_ptr__,QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *pQVar1;
  long in_FS_OFFSET;
  QGraphicsItem *that;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  local_48.xp = (qreal)pQVar1->q_ptr;
  QGraphicsItemPrivate::ensureSceneTransformRecursive(pQVar1,(QGraphicsItem **)&local_48);
  if ((pQVar1->field_0x167 & 0x40) == 0) {
    QPolygonF::QPolygonF((QPolygonF *)&local_48,rect);
    QTransform::map(__return_storage_ptr__);
    if ((QArrayData *)local_48.xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48.xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48.xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48.xp,0x10,0x10);
      }
    }
  }
  else {
    pQVar1 = (this->d_ptr).d;
    local_48.xp = rect->xp + (pQVar1->sceneTransform).m_matrix[2][0];
    local_48.yp = rect->yp + (pQVar1->sceneTransform).m_matrix[2][1];
    local_48.w = rect->w;
    local_48.h = rect->h;
    QPolygonF::QPolygonF(__return_storage_ptr__,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsItem::mapToScene(const QRectF &rect) const
{
    if (d_ptr->hasTranslateOnlySceneTransform())
        return rect.translated(d_ptr->sceneTransform.dx(), d_ptr->sceneTransform.dy());
    return d_ptr->sceneTransform.map(rect);
}